

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

void __thiscall LiteScript::Class::Class(Class *this,Class *c)

{
  reference __p;
  uint local_2c;
  allocator<LiteScript::Nullable<LiteScript::Variable>_> local_25;
  uint i;
  allocator<LiteScript::Nullable<LiteScript::Variable>_> allocator;
  Class *c_local;
  Class *this_local;
  
  std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::vector
            (&this->inherit,&c->inherit);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::vector(&this->s_members,&c->s_members);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::vector(&this->us_members,&c->us_members);
  std::array<LiteScript::Nullable<LiteScript::Variable>,_33UL>::array
            (&this->op_members,&c->op_members);
  this->constructor_index = c->constructor_index;
  this->memory = c->memory;
  std::allocator<LiteScript::Nullable<LiteScript::Variable>_>::allocator(&local_25);
  for (local_2c = 0; local_2c < 0x21; local_2c = local_2c + 1) {
    __p = std::array<LiteScript::Nullable<LiteScript::Variable>,_33UL>::operator[]
                    (&this->op_members,(ulong)local_2c);
    __gnu_cxx::new_allocator<LiteScript::Nullable<LiteScript::Variable>>::
    construct<LiteScript::Nullable<LiteScript::Variable>>
              ((new_allocator<LiteScript::Nullable<LiteScript::Variable>> *)&local_25,__p);
  }
  std::allocator<LiteScript::Nullable<LiteScript::Variable>_>::~allocator(&local_25);
  return;
}

Assistant:

LiteScript::Class::Class(const Class &c) :
    inherit(c.inherit), s_members(c.s_members), us_members(c.us_members), op_members(c.op_members),
    memory(c.memory), constructor_index(c.constructor_index)
{
    std::allocator<Nullable<Variable>> allocator;
    for (unsigned int i = 0; i < (unsigned int)OperatorType::OP_TYPE_NUMBER; i++)
        allocator.construct(&this->op_members[i]);
}